

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

NotEqualLayerParams * __thiscall
google::protobuf::Arena::DoCreateMessage<CoreML::Specification::NotEqualLayerParams>(Arena *this)

{
  void *ptr;
  NotEqualLayerParams *pNVar1;
  Arena *local_18;
  Arena *local_10;
  Arena *this_local;
  
  local_10 = this;
  ptr = AllocateInternal(this,0x18,8,(_func_void_void_ptr *)0x0,
                         (type_info *)&CoreML::Specification::NotEqualLayerParams::typeinfo);
  local_18 = this;
  pNVar1 = InternalHelper<CoreML::Specification::NotEqualLayerParams>::
           Construct<google::protobuf::Arena*>(ptr,&local_18);
  return pNVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* DoCreateMessage(Args&&... args) {
    return InternalHelper<T>::Construct(
        AllocateInternal(sizeof(T), alignof(T),
                         internal::ObjectDestructor<
                             InternalHelper<T>::is_destructor_skippable::value,
                             T>::destructor,
                         RTTI_TYPE_ID(T)),
        this, std::forward<Args>(args)...);
  }